

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::PrintCache(cmCacheManager *this,ostream *out)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  poVar1 = std::operator<<(out,"=================================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"CMakeCache Contents:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[3]._M_color != 4) {
      poVar1 = std::operator<<(out,(string *)(p_Var2 + 1));
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  std::operator<<(out,"\n\n");
  poVar1 = std::operator<<(out,"To change values in the CMakeCache, ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"edit CMakeCache.txt in your output directory.\n");
  poVar1 = std::operator<<(out,"=================================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void cmCacheManager::PrintCache(std::ostream& out) const
{
  out << "=================================================" << std::endl;
  out << "CMakeCache Contents:" << std::endl;
  for (auto const& i : this->Cache) {
    if (i.second.Type != cmStateEnums::INTERNAL) {
      out << i.first << " = " << i.second.Value << std::endl;
    }
  }
  out << "\n\n";
  out << "To change values in the CMakeCache, " << std::endl
      << "edit CMakeCache.txt in your output directory.\n";
  out << "=================================================" << std::endl;
}